

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variant.hpp
# Opt level: O0

void __thiscall
xll::detail::
variant_base_impl<xll::xlnum,xll::xlstr,xll::xlbool,xll::xlerr,xll::xlint,xll::xlsref,xll::xlref,xll::xlmulti,xll::xlflow,xll::xlbigdata,xll::xlmissing,xll::xlnil>
::destroy_impl::operator()(void)

{
  destroy_impl *this_local;
  
  return;
}

Assistant:

void operator()(I) const noexcept
        {
            using T = mp11::mp_at<mp11::mp_list<Ts...>, I>;
            switch (T::xltype::value) {
            case XLTYPE::xltypeStr:
            case XLTYPE::xltypeRef:
            case XLTYPE::xltypeMulti:
                if (self_->flags() & xlbitXLFree) {
                    // Excel allocated memory; call xlFree
                    auto pfn = detail::MdCallBack12();
	                if (pfn != nullptr)
                        (pfn)(xlFree, 1, (void **)&self_, nullptr);
                }
                else if (self_->flags() & xlbitDLLFree) {
                    // Destroyed in xlAutoFree12
                }
                else {
                    self_->st_.get(I()).~T();
                    self_->xltype_ = xltypeMissing;
                }
                break;
            default:
                break;
            }
        }